

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

void vkt::tessellation::beginCommandBuffer(DeviceInterface *vk,VkCommandBuffer commandBuffer)

{
  VkResult result;
  undefined8 local_38;
  VkCommandBufferBeginInfo info;
  VkCommandBuffer commandBuffer_local;
  DeviceInterface *vk_local;
  
  local_38 = 0x2a;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  info.pNext = (void *)0x1;
  info.flags = 0;
  info._20_4_ = 0;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)commandBuffer;
  result = (*vk->_vptr_DeviceInterface[0x49])(vk,commandBuffer,&local_38);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/tessellation/vktTessellationUtil.cpp"
                    ,0x100);
  return;
}

Assistant:

void beginCommandBuffer (const DeviceInterface& vk, const VkCommandBuffer commandBuffer)
{
	const VkCommandBufferBeginInfo info =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
		DE_NULL,										// const void*                              pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags                flags;
		DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
	};
	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &info));
}